

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswCut.c
# Opt level: O2

Aig_Obj_t * Csw_ObjSweep(Csw_Man_t *p,Aig_Obj_t *pObj,int fTriv)

{
  Aig_Obj_t *pAVar1;
  int iVar2;
  uint uVar3;
  Csw_Cut_t *pCut;
  abctime aVar4;
  uint *pTruth;
  abctime aVar5;
  Aig_Obj_t *pAVar6;
  char cVar7;
  uint uVar8;
  char *__function;
  int iVar9;
  uint uVar10;
  int iVar11;
  char *__assertion;
  Csw_Cut_t *pCVar12;
  Csw_Cut_t *pCVar13;
  long lVar14;
  int iVar15;
  bool bVar16;
  Csw_Cut_t *local_58;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                  ,0x1f7,"Aig_Obj_t *Csw_ObjSweep(Csw_Man_t *, Aig_Obj_t *, int)");
  }
  if ((0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7) &&
     (p->pCuts[pObj->Id] == (Csw_Cut_t *)0x0)) {
    pAVar6 = pObj->pFanin0;
    pAVar1 = pObj->pFanin1;
    Csw_ObjPrepareCuts(p,pObj,fTriv);
    local_58 = p->pCuts[*(int *)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x24)];
    iVar11 = p->nCutsMax;
    for (iVar9 = 0; iVar9 < iVar11; iVar9 = iVar9 + 1) {
      if ('\0' < local_58->nFanins) {
        pCVar12 = p->pCuts[*(int *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x24)];
        for (iVar15 = 0; iVar15 < iVar11; iVar15 = iVar15 + 1) {
          if (('\0' < pCVar12->nFanins) &&
             (iVar2 = Kit_WordCountOnes(pCVar12->uSign | local_58->uSign), iVar2 <= p->nLeafMax)) {
            pCut = p->pCuts[pObj->Id];
            pCVar13 = (Csw_Cut_t *)0x0;
            while (bVar16 = iVar11 != 0, iVar11 = iVar11 + -1, bVar16) {
              if (pCut->nFanins == '\0') goto LAB_0041e2f1;
              if ((pCVar13 == (Csw_Cut_t *)0x0) || (pCVar13->Cost < pCut->Cost)) {
                pCVar13 = pCut;
              }
              pCut = (Csw_Cut_t *)((long)&pCut->pNext + (long)pCut->nCutSize);
            }
            if (pCVar13 == (Csw_Cut_t *)0x0) {
              __assertion = "pCutMax != NULL";
              __function = "Csw_Cut_t *Csw_CutFindFree(Csw_Man_t *, Aig_Obj_t *)";
              uVar3 = 0x69;
LAB_0041e631:
              __assert_fail(__assertion,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                            ,uVar3,__function);
            }
            pCVar13->nFanins = '\0';
            pCut = pCVar13;
LAB_0041e2f1:
            aVar4 = Abc_Clock();
            iVar11 = Csw_CutMerge(p,local_58,pCVar12,pCut);
            if (iVar11 == 0) {
              if (pCut->nFanins != '\0') {
                __assert_fail("pCut->nFanins == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                              ,0x212,"Aig_Obj_t *Csw_ObjSweep(Csw_Man_t *, Aig_Obj_t *, int)");
              }
            }
            else {
              iVar11 = Csw_CutFilter(p,pObj,pCut);
              if (iVar11 == 0) {
                pTruth = Csw_CutComputeTruth(p,pCut,local_58,pCVar12,*(uint *)&pObj->pFanin0 & 1,
                                             *(uint *)&pObj->pFanin1 & 1);
                cVar7 = pCut->nFanins;
                iVar11 = Kit_TruthSupportSize(pTruth,p->nLeafMax);
                aVar5 = Abc_Clock();
                p->timeCuts = p->timeCuts + (aVar5 - aVar4);
                if (iVar11 == 1) {
                  p->nNodesTriv1 = p->nNodesTriv1 + 1;
                  uVar3 = Kit_TruthSupport(pTruth,p->nLeafMax);
                  for (uVar10 = 0;
                      (uVar8 = 0xffffffff, uVar10 != 0x20 &&
                      (uVar8 = uVar10, (uVar3 >> (uVar10 & 0x1f) & 1) == 0)); uVar10 = uVar10 + 1) {
                  }
                  if ((int)uVar8 < (int)pCut->nFanins) {
                    pAVar6 = Aig_ManObj(p->pManRes,
                                        *(int *)((long)&pCut[1].pNext + (long)(int)uVar8 * 4));
                    return (Aig_Obj_t *)((ulong)(*pTruth & 1) ^ (ulong)pAVar6);
                  }
                  __assert_fail("iVar < pCut->nFanins",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                                ,0x22d,"Aig_Obj_t *Csw_ObjSweep(Csw_Man_t *, Aig_Obj_t *, int)");
                }
                if (iVar11 == 0) {
                  p->nNodesTriv0 = p->nNodesTriv0 + 1;
                  return (Aig_Obj_t *)((ulong)(*pTruth & 1) ^ (ulong)p->pManRes->pConst1 ^ 1);
                }
                if (((iVar11 == 2) && ('\x02' < cVar7)) &&
                   (pAVar6 = Csw_ObjTwoVarCut(p,pCut), pAVar6 != (Aig_Obj_t *)0x0)) {
                  p->nNodesTriv2 = p->nNodesTriv2 + 1;
                  return pAVar6;
                }
                aVar4 = Abc_Clock();
                if (pCut->nFanins < '\x03') {
                  pAVar6 = (Aig_Obj_t *)0x0;
                }
                else {
                  pAVar6 = Csw_TableCutLookup(p,pCut);
                }
                aVar5 = Abc_Clock();
                p->timeHash = p->timeHash + (aVar5 - aVar4);
                if (pAVar6 != (Aig_Obj_t *)0x0) {
                  p->nNodesCuts = p->nNodesCuts + 1;
                  return pAVar6;
                }
                cVar7 = pCut->nFanins;
                if (cVar7 < '\x01') {
                  __assertion = "pCut->nFanins > 0";
                  __function = "int Csw_CutFindCost(Csw_Man_t *, Csw_Cut_t *)";
                  uVar3 = 0x31;
                  goto LAB_0041e631;
                }
                iVar11 = 0;
                for (lVar14 = 0; lVar14 < cVar7; lVar14 = lVar14 + 1) {
                  pAVar6 = Aig_ManObj(p->pManRes,*(int *)((long)&pCut[1].pNext + lVar14 * 4));
                  cVar7 = pCut->nFanins;
                  if (pAVar6 == (Aig_Obj_t *)0x0) break;
                  iVar11 = iVar11 + p->pnRefs[pAVar6->Id];
                }
                iVar11 = (iVar11 * 100) / (int)cVar7;
                pCut->Cost = iVar11;
                if (cVar7 < '\x01') {
                  __assert_fail("pCut->nFanins > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                                ,0x245,"Aig_Obj_t *Csw_ObjSweep(Csw_Man_t *, Aig_Obj_t *, int)");
                }
                if (iVar11 < 1) {
                  __assert_fail("pCut->Cost > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                                ,0x246,"Aig_Obj_t *Csw_ObjSweep(Csw_Man_t *, Aig_Obj_t *, int)");
                }
              }
              else if (pCut->nFanins != '\0') {
                __assert_fail("pCut->nFanins == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                              ,0x218,"Aig_Obj_t *Csw_ObjSweep(Csw_Man_t *, Aig_Obj_t *, int)");
              }
            }
          }
          pCVar12 = (Csw_Cut_t *)((long)&pCVar12->pNext + (long)pCVar12->nCutSize);
          iVar11 = p->nCutsMax;
        }
      }
      local_58 = (Csw_Cut_t *)((long)&local_58->pNext + (long)local_58->nCutSize);
    }
    p->nNodesTried = p->nNodesTried + 1;
    aVar4 = Abc_Clock();
    pCVar12 = p->pCuts[pObj->Id];
    for (iVar11 = 0; iVar11 < p->nCutsMax; iVar11 = iVar11 + 1) {
      if ('\x02' < pCVar12->nFanins) {
        if (pCVar12->Cost < 1) {
          __assert_fail("pCut->Cost > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                        ,0x250,"Aig_Obj_t *Csw_ObjSweep(Csw_Man_t *, Aig_Obj_t *, int)");
        }
        Csw_TableCutInsert(p,pCVar12);
      }
      pCVar12 = (Csw_Cut_t *)((long)&pCVar12->pNext + (long)pCVar12->nCutSize);
    }
    aVar5 = Abc_Clock();
    p->timeHash = p->timeHash + (aVar5 - aVar4);
  }
  return pObj;
}

Assistant:

Aig_Obj_t * Csw_ObjSweep( Csw_Man_t * p, Aig_Obj_t * pObj, int fTriv )
{
    int fUseResub = 1;
    Csw_Cut_t * pCut0, * pCut1, * pCut, * pCutSet;
    Aig_Obj_t * pFanin0 = Aig_ObjFanin0(pObj);
    Aig_Obj_t * pFanin1 = Aig_ObjFanin1(pObj);
    Aig_Obj_t * pObjNew;
    unsigned * pTruth;
    int i, k, nVars, nFanins, iVar;
    abctime clk;

    assert( !Aig_IsComplement(pObj) );
    if ( !Aig_ObjIsNode(pObj) )
        return pObj;
    if ( Csw_ObjCuts(p, pObj) )
        return pObj;
    // the node is not processed yet
    assert( Csw_ObjCuts(p, pObj) == NULL );
    assert( Aig_ObjIsNode(pObj) );

    // set up the first cut
    pCutSet = Csw_ObjPrepareCuts( p, pObj, fTriv );

    // compute pair-wise cut combinations while checking table
    Csw_ObjForEachCut( p, pFanin0, pCut0, i )
    if ( pCut0->nFanins > 0 )
    Csw_ObjForEachCut( p, pFanin1, pCut1, k )
    if ( pCut1->nFanins > 0 )
    {
        // make sure K-feasible cut exists
        if ( Kit_WordCountOnes(pCut0->uSign | pCut1->uSign) > p->nLeafMax )
            continue;
        // get the next cut of this node
        pCut = Csw_CutFindFree( p, pObj );
clk = Abc_Clock();
        // assemble the new cut
        if ( !Csw_CutMerge( p, pCut0, pCut1, pCut ) )
        {
            assert( pCut->nFanins == 0 );
            continue;
        }
        // check containment
        if ( Csw_CutFilter( p, pObj, pCut ) )
        {
            assert( pCut->nFanins == 0 );
            continue;
        }
        // create its truth table
        pTruth = Csw_CutComputeTruth( p, pCut, pCut0, pCut1, Aig_ObjFaninC0(pObj), Aig_ObjFaninC1(pObj) );
        // support minimize the truth table
        nFanins = pCut->nFanins;
//        nVars = Csw_CutSupportMinimize( p, pCut ); // leads to quality degradation
        nVars = Kit_TruthSupportSize( pTruth, p->nLeafMax );
p->timeCuts += Abc_Clock() - clk;

        // check for trivial truth tables
        if ( nVars == 0 )
        {
            p->nNodesTriv0++;
            return Aig_NotCond( Aig_ManConst1(p->pManRes), !(pTruth[0] & 1) );
        }
        if ( nVars == 1 )
        {
            p->nNodesTriv1++;
            iVar = Kit_WordFindFirstBit( Kit_TruthSupport(pTruth, p->nLeafMax) );
            assert( iVar < pCut->nFanins );
            return Aig_NotCond( Aig_ManObj(p->pManRes, pCut->pFanins[iVar]), (pTruth[0] & 1) );
        }
        if ( nVars == 2 && nFanins > 2 && fUseResub )
        {
            if ( (pObjNew = Csw_ObjTwoVarCut( p, pCut )) )
            {
                p->nNodesTriv2++;
                return pObjNew;
            }
        }

        // check if an equivalent node with the same cut exists
clk = Abc_Clock();
        pObjNew = pCut->nFanins > 2 ? Csw_TableCutLookup( p, pCut ) : NULL;
p->timeHash += Abc_Clock() - clk;
        if ( pObjNew )
        {
            p->nNodesCuts++;
            return pObjNew;
        }

        // assign the cost
        pCut->Cost = Csw_CutFindCost( p, pCut );
        assert( pCut->nFanins > 0 );
        assert( pCut->Cost > 0 );
    }
    p->nNodesTried++;

    // load the resulting cuts into the table
clk = Abc_Clock();
    Csw_ObjForEachCut( p, pObj, pCut, i )
    {
        if ( pCut->nFanins > 2 )
        {
            assert( pCut->Cost > 0 );
            Csw_TableCutInsert( p, pCut );
        }
    }
p->timeHash += Abc_Clock() - clk;

    // return the node if could not replace it
    return pObj;
}